

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializedResourceSignatureImpl.cpp
# Opt level: O3

PipelineResourceSignatureDesc * __thiscall
Diligent::SerializedResourceSignatureImpl::GetDesc(SerializedResourceSignatureImpl *this)

{
  PipelineResourceSignatureDesc *pPVar1;
  string msg;
  string local_28;
  
  pPVar1 = this->m_pDesc;
  if (pPVar1 == (PipelineResourceSignatureDesc *)0x0) {
    FormatString<char[34]>(&local_28,(char (*) [34])"No device signatures initialized!");
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"GetDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedResourceSignatureImpl.cpp"
               ,0x82);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
    pPVar1 = &GetDesc::NullDesc;
  }
  return pPVar1;
}

Assistant:

const PipelineResourceSignatureDesc& SerializedResourceSignatureImpl::GetDesc() const
{
    if (m_pDesc != nullptr)
        return *m_pDesc;

    UNEXPECTED("No device signatures initialized!");
    static constexpr PipelineResourceSignatureDesc NullDesc;
    return NullDesc;
}